

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O2

SAttribute * __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::getAttributeByName
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this,unsigned_long *name)

{
  long lVar1;
  bool bVar2;
  SAttribute *pSVar3;
  long lVar4;
  long lVar5;
  string<unsigned_long> n;
  
  if (name == (unsigned_long *)0x0) {
    pSVar3 = (SAttribute *)0x0;
  }
  else {
    core::string<unsigned_long>::string<unsigned_long>(&n,name);
    lVar5 = -1;
    pSVar3 = (SAttribute *)0x0;
    lVar1 = -0x20;
    do {
      lVar4 = lVar1;
      lVar5 = lVar5 + 1;
      if ((int)(this->Attributes).used <= lVar5) goto LAB_005b31d1;
      bVar2 = core::string<unsigned_long>::operator==
                        ((string<unsigned_long> *)
                         ((long)&(this->Attributes).data[1].Name.array + lVar4),&n);
      lVar1 = lVar4 + 0x20;
    } while (!bVar2);
    pSVar3 = (SAttribute *)((long)&(this->Attributes).data[1].Name.array + lVar4);
LAB_005b31d1:
    core::string<unsigned_long>::~string(&n);
  }
  return pSVar3;
}

Assistant:

const SAttribute* getAttributeByName(const char_type* name) const
	{
		if (!name)
			return 0;

		core::string<char_type> n = name;

		for (int i=0; i<(int)Attributes.size(); ++i)
			if (Attributes[i].Name == n)
				return &Attributes[i];

		return 0;
	}